

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImGuiStorage::Clear(ImGuiStorage *this)

{
  ImGuiStorage *this_local;
  
  ImVector<ImGuiStorage::ImGuiStoragePair>::clear(&this->Data);
  return;
}

Assistant:

void                Clear() { Data.clear(); }